

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_alternative_serial.cpp
# Opt level: O2

void test_break(void)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  SpyingSerial::clear(&Serial2);
  std::operator<<((ostream *)&Serial2.field_0x10,"test_alternative_serial.cpp");
  std::operator<<((ostream *)&Serial2.field_0x10,":32: ");
  SpyingSerial::println<char[35]>(&Serial2,(char (*) [35])"BREAK! (press [enter] to continue)");
  SpyingSerial::flush(&Serial2);
  ArduinoTrace::pause<SpyingSerial>(&Serial2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "test_alternative_serial.cpp:\\d+: BREAK.+\r\nflush\\(\\)\r\nread\\(\\)\r\n",&local_51)
  ;
  ASSERT_RE(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void test_break() {
  Serial2.clear();
  BREAK();
  ASSERT_RE(Serial2.log(),
            "test_alternative_serial.cpp:\\d+: BREAK.+\r\n"
            "flush\\(\\)\r\n"
            "read\\(\\)\r\n");
}